

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

ptrlen BinarySource_get_pstring(BinarySource *src)

{
  _Bool _Var1;
  ulong wanted;
  size_t sVar2;
  size_t len;
  uchar *ucp;
  BinarySource *src_local;
  
  _Var1 = BinarySource_data_avail(src,1);
  if (_Var1) {
    sVar2 = src->pos;
    src->pos = sVar2 + 1;
    wanted = (ulong)*(byte *)((long)src->data + sVar2);
    _Var1 = BinarySource_data_avail(src,wanted);
    if (_Var1) {
      sVar2 = wanted + src->pos;
      src->pos = sVar2;
      _src_local = make_ptrlen((void *)((long)src->data + (sVar2 - wanted)),wanted);
    }
    else {
      _src_local = make_ptrlen(anon_var_dwarf_2471b + 10,0);
    }
  }
  else {
    _src_local = make_ptrlen(anon_var_dwarf_2471b + 10,0);
  }
  return _src_local;
}

Assistant:

ptrlen BinarySource_get_pstring(BinarySource *src)
{
    const unsigned char *ucp;
    size_t len;

    if (!avail(1))
        return make_ptrlen("", 0);

    ucp = consume(1);
    len = *ucp;

    if (!avail(len))
        return make_ptrlen("", 0);

    return make_ptrlen(consume(len), len);
}